

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<short,_std::allocator<unsigned_long>_>::Marray
          (Marray<short,_std::allocator<unsigned_long>_> *this,
          Marray<short,_std::allocator<unsigned_long>_> *in)

{
  short *__dest;
  allocator_type local_11;
  
  View<short,_false,_std::allocator<unsigned_long>_>::View
            (&this->super_View<short,_false,_std::allocator<unsigned_long>_>,&local_11);
  testInvariant(in);
  if ((in->super_View<short,_false,_std::allocator<unsigned_long>_>).data_ == (pointer)0x0) {
    (this->super_View<short,_false,_std::allocator<unsigned_long>_>).data_ = (pointer)0x0;
  }
  else {
    __dest = __gnu_cxx::new_allocator<short>::allocate
                       ((new_allocator<short> *)&this->field_0x40,
                        (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.
                        size_,(void *)0x0);
    (this->super_View<short,_false,_std::allocator<unsigned_long>_>).data_ = __dest;
    memcpy(__dest,(in->super_View<short,_false,_std::allocator<unsigned_long>_>).data_,
           (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.size_ * 2);
  }
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            (&(this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_,
             &(in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_);
  testInvariant(this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const Marray<T, A>& in
)
:   dataAllocator_(in.dataAllocator_) 
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if(in.data_ == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    this->geometry_ = in.geometry_;
    testInvariant();
}